

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PQ.h
# Opt level: O2

void __thiscall
ProductQuantization<float,_KBalls<float>_>::productJoinClusters
          (ProductQuantization<float,_KBalls<float>_> *this)

{
  pointer pKVar1;
  long lVar2;
  int i;
  ulong uVar3;
  long lVar4;
  function<void_(int,_const_Cluster<float>_&)> mergeRecursive;
  anon_class_16_2_9c50e7d5 local_38;
  
  local_38.mergeRecursive = &mergeRecursive;
  mergeRecursive.super__Function_base._M_manager = (_Manager_type)0x0;
  mergeRecursive._M_invoker = (_Invoker_type)0x0;
  mergeRecursive.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  mergeRecursive.super__Function_base._M_functor._8_8_ = 0;
  local_38.this = this;
  std::function<void(int,Cluster<float>const&)>::operator=
            ((function<void(int,Cluster<float>const&)> *)&mergeRecursive,&local_38);
  pKVar1 = (this->kMeans_).super__Vector_base<KBalls<float>,_std::allocator<KBalls<float>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar4 = 0;
  for (uVar3 = 0;
      lVar2 = *(long *)&(pKVar1->super_StandardKMeans<float>).super_AbstractKMeans<float>.clusters_.
                        super__Vector_base<Cluster<float>,_std::allocator<Cluster<float>_>_>._M_impl
                        .super__Vector_impl_data,
      uVar3 < (ulong)((long)*(pointer *)
                             ((long)&(pKVar1->super_StandardKMeans<float>).
                                     super_AbstractKMeans<float>.clusters_ + 8) - lVar2 >> 6);
      uVar3 = uVar3 + 1) {
    std::function<void_(int,_const_Cluster<float>_&)>::operator()
              (&mergeRecursive,1,(Cluster<float> *)(lVar2 + lVar4));
    lVar4 = lVar4 + 0x40;
  }
  std::_Function_base::~_Function_base(&mergeRecursive.super__Function_base);
  return;
}

Assistant:

void ProductQuantization<DataType, KMeansType>::productJoinClusters() {

    /**
     *  join function for two code book.
     */
    std::function<void (int, const Cluster<DataType>& )> mergeRecursive;

    mergeRecursive = [&] (int codebook_index, const Cluster<DataType>& cluster) {

        if (codebook_index == num_codebook_) {

            tables_.emplace(std::make_pair(cluster.getID(), cluster));
        } else {

            KMeansType& subKMeans = kMeans_[codebook_index];
            for (int i = 0; i < clusterK_; ++i) {
                // joined with the codebook_index'th code book
                Cluster<DataType> mergedCluster = cluster.merge( subKMeans.getClusters()[i], clusterK_ );
                // then joined with the (codebook_index+1)'th code book
                mergeRecursive(codebook_index+1, mergedCluster );
            }
        }
    };

    // start with kMeans[0]
    KMeansType& subKMeans = kMeans_[0];

    for (int i = 0; i < subKMeans.getClusters().size(); ++i) {

        // initialize cluster with al clusters in kMeans[0],
        const Cluster<DataType>& initialCluster =  subKMeans.getClusters()[i];
        // then merge clusters in kMeans[1], then merge cluster in kMeans[2] ....
        mergeRecursive(1, initialCluster );
    }

}